

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

Instr * __thiscall Func::GetFunctionEntryInsertionPoint(Func *this)

{
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  RegionType RVar4;
  BOOL BVar5;
  Func *pFVar6;
  undefined4 *puVar7;
  LabelInstr *this_00;
  Region *this_01;
  bool local_31;
  Instr *local_28;
  Instr *insertInsert;
  Func *this_local;
  
  pFVar6 = GetTopFunc(this);
  if (pFVar6 != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x7ea,"(this->GetTopFunc() == this)","this->GetTopFunc() == this");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (this->lastConstantAddressRegLoadInstr != (Instr *)0x0) {
    return this->lastConstantAddressRegLoadInstr->m_next;
  }
  local_28 = this->m_headInstr;
  BVar5 = HasTry(this);
  if (BVar5 != 0) {
    local_28 = local_28->m_next;
    IVar3 = IR::Instr::GetKind(local_28);
    local_31 = true;
    if (IVar3 != InstrKindLabel) {
      local_31 = IR::Instr::IsProfiledLabelInstr(local_28);
    }
    if (local_31 != false) {
      this_00 = IR::Instr::AsLabelInstr(local_28);
      this_01 = IR::LabelInstr::GetRegion(this_00);
      RVar4 = Region::GetType(this_01);
      if (RVar4 == RegionTypeRoot) goto LAB_005573aa;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x7f7,
                       "(insertInsert->IsLabelInstr() && insertInsert->AsLabelInstr()->GetRegion()->GetType() == RegionTypeRoot)"
                       ,
                       "insertInsert->IsLabelInstr() && insertInsert->AsLabelInstr()->GetRegion()->GetType() == RegionTypeRoot"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
LAB_005573aa:
  return local_28->m_next;
}

Assistant:

IR::Instr *
Func::GetFunctionEntryInsertionPoint()
{
    Assert(this->GetTopFunc() == this);
    IR::Instr * insertInsert = this->lastConstantAddressRegLoadInstr;
    if (insertInsert != nullptr)
    {
        return insertInsert->m_next;
    }

    insertInsert = this->m_headInstr;

    if (this->HasTry())
    {
        // Insert it inside the root region
        insertInsert = insertInsert->m_next;
        Assert(insertInsert->IsLabelInstr() && insertInsert->AsLabelInstr()->GetRegion()->GetType() == RegionTypeRoot);
    }

    return insertInsert->m_next;
}